

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O1

void __thiscall sc_core::sc_trace_file_base::delta_cycles(sc_trace_file_base *this,bool flag)

{
  undefined7 in_register_00000031;
  
  this->trace_delta_cycles_ = flag;
  if ((int)CONCAT71(in_register_00000031,flag) != 0) {
    sc_object::register_simulation_phase_callback(&this->super_sc_object,0x400);
    return;
  }
  sc_object::unregister_simulation_phase_callback(&this->super_sc_object,0x400);
  return;
}

Assistant:

void
sc_trace_file_base::delta_cycles( bool flag )
{
    trace_delta_cycles_ = flag;
#if SC_TRACING_PHASE_CALLBACKS_
    if( trace_delta_cycles_ ) {
        sc_object::register_simulation_phase_callback( SC_END_OF_UPDATE );
    } else {
        sc_object::unregister_simulation_phase_callback( SC_END_OF_UPDATE );
    }
#endif
}